

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltablib.c
# Opt level: O1

int tinsert(lua_State *L)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  lua_Integer lVar4;
  int n;
  
  luaL_checktype(L,1,5);
  iVar2 = luaL_len(L,1);
  iVar3 = lua_gettop(L);
  n = iVar2 + 1;
  if (iVar3 != 2) {
    if (iVar3 != 3) {
      iVar2 = luaL_error(L,"wrong number of arguments to \'insert\'");
      return iVar2;
    }
    lVar4 = luaL_checkinteger(L,2);
    n = (int)lVar4;
    if (iVar2 + 1 < n || n < 1) {
      luaL_argerror(L,2,"position out of bounds");
    }
    if (n <= iVar2) {
      do {
        lua_rawgeti(L,1,iVar2);
        lua_rawseti(L,1,iVar2 + 1);
        bVar1 = n < iVar2;
        iVar2 = iVar2 + -1;
      } while (bVar1);
    }
  }
  lua_rawseti(L,1,n);
  return 0;
}

Assistant:

static int tinsert (lua_State *L) {
  int e = aux_getn(L, 1) + 1;  /* first empty element */
  int pos;  /* where to insert new element */
  switch (lua_gettop(L)) {
    case 2: {  /* called with only 2 arguments */
      pos = e;  /* insert new element at the end */
      break;
    }
    case 3: {
      int i;
      pos = luaL_checkint(L, 2);  /* 2nd argument is the position */
      luaL_argcheck(L, 1 <= pos && pos <= e, 2, "position out of bounds");
      for (i = e; i > pos; i--) {  /* move up elements */
        lua_rawgeti(L, 1, i-1);
        lua_rawseti(L, 1, i);  /* t[i] = t[i-1] */
      }
      break;
    }
    default: {
      return luaL_error(L, "wrong number of arguments to " LUA_QL("insert"));
    }
  }
  lua_rawseti(L, 1, pos);  /* t[pos] = v */
  return 0;
}